

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O0

void __thiscall
protozero::
iterator_range<protozero::const_fixed_iterator<int>,_std::pair<protozero::const_fixed_iterator<int>,_protozero::const_fixed_iterator<int>_>_>
::drop_front(iterator_range<protozero::const_fixed_iterator<int>,_std::pair<protozero::const_fixed_iterator<int>,_protozero::const_fixed_iterator<int>_>_>
             *this)

{
  bool bVar1;
  assert_error *this_00;
  iterator_range<protozero::const_fixed_iterator<int>,_std::pair<protozero::const_fixed_iterator<int>,_protozero::const_fixed_iterator<int>_>_>
  *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    const_fixed_iterator<int>::operator++((const_fixed_iterator<int> *)this);
    return;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"!empty()");
  __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
}

Assistant:

void drop_front() {
        protozero_assert(!empty());
        ++this->first;
    }